

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O1

void __thiscall covenant::CFG::check_well_formed(CFG *this)

{
  int iVar1;
  pointer pvVar2;
  ostream *poVar3;
  pointer pPVar4;
  long *plVar5;
  ulong uVar6;
  size_t in_RCX;
  ulong uVar7;
  ulong uVar8;
  void *__buf;
  Sym s;
  ulong uVar9;
  bool bVar10;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  ostringstream error_msg;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_250;
  ulong local_230;
  CFG local_228;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  bVar10 = (this->prods).
           super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish ==
           (this->prods).
           super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (bVar10) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"ERROR: grammar must have at least one production rule.",0x36);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
  }
  pvVar2 = (this->prods).
           super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->prods).
      super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar2) {
    s.x = 1;
    uVar7 = 0;
    uVar6 = 1;
    do {
      in_RCX = uVar6;
      if (pvVar2[uVar7].
          super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          pvVar2[uVar7].
          super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ERROR: ",7);
        poVar3 = operator<<((ostream *)local_1a8,s);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3," non-terminal symbol without rule.\n",0x23);
        bVar10 = true;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Also possible a terminal misinterpreted as nonterminal.\n",
                   0x38);
      }
      pvVar2 = (this->prods).
               super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->prods).
                     super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
              -0x5555555555555555;
      s.x = s.x + 2;
      uVar7 = in_RCX;
      uVar6 = (ulong)((int)in_RCX + 1);
    } while (in_RCX <= uVar8 && uVar8 - in_RCX != 0);
  }
  if (!(bool)((this->prods).
              super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->prods).
              super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start | bVar10)) {
    uVar7 = 0;
    do {
      pvVar2 = (this->prods).
               super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar4 = pvVar2[uVar7].
               super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_230 = uVar7;
      if ((*(pointer *)
            ((long)&pvVar2[uVar7].
                    super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                    ._M_impl.super__Vector_impl_data + 8) != pPVar4) && (!bVar10)) {
        uVar6 = 0;
        do {
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                    (&local_250,
                     (this->rules).
                     super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + pPVar4[uVar6].rule);
          if (((local_250.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_250.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start) &&
              (local_250.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
               super__Vector_impl_data._M_finish !=
               local_250.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
               super__Vector_impl_data._M_start)) && (!bVar10)) {
            uVar8 = 0;
            uVar9 = 1;
            do {
              if ((local_250.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar8].x & 1U) == 0) {
                iVar1 = local_250.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar8].x >> 1;
                if ((iVar1 < this->alphstart) || (this->alphstart + this->alphsz <= iVar1)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"ERROR: some terminal symbol is out of range. ",
                             0x2d);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"It must be between ",0x13);
                  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,this->alphstart)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar3," and ",5);
                  plVar5 = (long *)std::ostream::operator<<(poVar3,this->alphsz + this->alphstart);
                  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
                  std::ostream::put((char)plVar5);
                  bVar10 = true;
                  std::ostream::flush();
                }
              }
            } while ((uVar9 < (ulong)((long)local_250.
                                            super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_250.
                                            super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 2)) &&
                    (uVar8 = uVar9, uVar9 = (ulong)((int)uVar9 + 1), !bVar10));
          }
          if (local_250.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_250.
                            super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          uVar6 = (ulong)((int)uVar6 + 1);
          pvVar2 = (this->prods).
                   super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pPVar4 = pvVar2[uVar7].
                   super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while ((uVar6 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar2[uVar7].
                                                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)pPVar4 >> 2)) && (!bVar10));
      }
      uVar7 = (ulong)((int)local_230 + 1);
      in_RCX = 0xaaaaaaaaaaaaaaab;
      uVar6 = ((long)(this->prods).
                     super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->prods).
                     super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while ((uVar7 <= uVar6 && uVar6 - uVar7 != 0) && (!bVar10));
  }
  if (bVar10) {
    CFG(&local_228,this);
    write(&local_228,0x1ad2b8,__buf,in_RCX);
    poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__cxx11::stringbuf::str();
    std::operator<<(poVar3,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    ~CFG(&local_228);
    exit(1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

inline void check_well_formed()
    {
      bool error=false;
      ostringstream error_msg;
      if (prods.size() == 0)
      {
        error=true;
        error_msg << "ERROR: grammar must have at least one production rule." << endl;
      }
      for( unsigned int vv = 0; vv < prods.size(); vv++ )
      {
        if (prods[vv].size() == 0){
          error=true;
          error_msg << "ERROR: " 
                    << Sym::mkVar(vv) << " non-terminal symbol without rule.\n"; 
          error_msg << "Also possible a terminal misinterpreted as nonterminal.\n";
        }
      }
      for ( unsigned int vv = 0; (vv < prods.size() && !error); vv++ )
      {
        for ( unsigned int ri = 0; (ri < prods[vv].size() && !error); ri++ )
        {
          const int r = prods[vv][ri].rule;
          vector<Sym> RHS = rules[r];
          if (RHS.size() == 0) continue;
          for (unsigned k=0; ( k < RHS.size() && !error) ;k++)
          {
            if (RHS[k].isTerm () && 
                !(RHS[k].symID () >= alphstart && 
                  RHS[k].symID()  <  alphstart+alphsz)){
              error=true;
              error_msg << "ERROR: some terminal symbol is out of range. ";
              error_msg << "It must be between " << alphstart << " and " << alphstart+alphsz << endl;   
            }
          }
        }
      }
      if (error)
      {
        cout << *this << endl << error_msg.str();
        exit(1);
      }
    }